

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

VarInfo * gola_findlabel(LexState *ls,GCstr *name)

{
  VarInfo *pVVar1;
  
  pVVar1 = ls->vstack + ls->fs->bl->vstart;
  while( true ) {
    if (ls->vstack + ls->vtop <= pVVar1) {
      return (VarInfo *)0x0;
    }
    if (((GCstr *)(pVVar1->name).gcptr64 == name) && ((pVVar1->info & 4) != 0)) break;
    pVVar1 = pVVar1 + 1;
  }
  return pVVar1;
}

Assistant:

static VarInfo *gola_findlabel(LexState *ls, GCstr *name)
{
  VarInfo *v = ls->vstack + ls->fs->bl->vstart;
  VarInfo *ve = ls->vstack + ls->vtop;
  for (; v < ve; v++)
    if (strref(v->name) == name && gola_islabel(v))
      return v;
  return NULL;
}